

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O1

AssertionResult __thiscall
testing::internal::
CmpHelperEQ<std::__cxx11::basic_string<fmt::v5::char8_t,std::char_traits<fmt::v5::char8_t>,std::allocator<fmt::v5::char8_t>>,fmt::v5::u8string_view>
          (internal *this,char *expected_expression,char *actual_expression,
          basic_string<fmt::v5::char8_t,_std::char_traits<fmt::v5::char8_t>,_std::allocator<fmt::v5::char8_t>_>
          *expected,u8string_view *actual)

{
  basic_string<fmt::v5::char8_t,_std::char_traits<fmt::v5::char8_t>,_std::allocator<fmt::v5::char8_t>_>
  *pbVar1;
  basic_string<fmt::v5::char8_t,_std::char_traits<fmt::v5::char8_t>,_std::allocator<fmt::v5::char8_t>_>
  *value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  basic_string<fmt::v5::char8_t,_std::char_traits<fmt::v5::char8_t>,_std::allocator<fmt::v5::char8_t>_>
  *pbVar3;
  undefined1 *puVar4;
  bool bVar5;
  bool bVar6;
  AssertionResult AVar7;
  string local_60;
  string local_40;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar2
  ;
  
  pbVar1 = (basic_string<fmt::v5::char8_t,_std::char_traits<fmt::v5::char8_t>,_std::allocator<fmt::v5::char8_t>_>
            *)expected->_M_string_length;
  value = (basic_string<fmt::v5::char8_t,_std::char_traits<fmt::v5::char8_t>,_std::allocator<fmt::v5::char8_t>_>
           *)(actual->super_basic_string_view<fmt::v5::char8_t>).size_;
  pbVar3 = value;
  if (pbVar1 < value) {
    pbVar3 = pbVar1;
  }
  if (pbVar3 == (basic_string<fmt::v5::char8_t,_std::char_traits<fmt::v5::char8_t>,_std::allocator<fmt::v5::char8_t>_>
                 *)0x0) {
    bVar5 = true;
  }
  else {
    puVar4 = (undefined1 *)0x0;
    do {
      bVar5 = puVar4[(long)(actual->super_basic_string_view<fmt::v5::char8_t>).data_] ==
              puVar4[(long)(expected->_M_dataplus)._M_p];
      if (!bVar5) break;
      bVar6 = (undefined1 *)((long)&pbVar3[-1].field_2 + 0xf) != puVar4;
      puVar4 = puVar4 + 1;
    } while (bVar6);
  }
  if ((pbVar1 == value) && (bVar5)) {
    AVar7 = AssertionSuccess();
    sVar2 = AVar7.message_.ptr_;
  }
  else {
    PrintToString<std::__cxx11::basic_string<fmt::v5::char8_t,std::char_traits<fmt::v5::char8_t>,std::allocator<fmt::v5::char8_t>>>
              (&local_40,(testing *)expected,value);
    PrintToString<fmt::v5::u8string_view>(&local_60,actual);
    AVar7 = EqFailure(this,expected_expression,actual_expression,&local_40,&local_60,false);
    sVar2 = AVar7.message_.ptr_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
      sVar2.ptr_ = extraout_RDX;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
      sVar2.ptr_ = extraout_RDX_00;
    }
  }
  AVar7.message_.ptr_ = sVar2.ptr_;
  AVar7._0_8_ = this;
  return AVar7;
}

Assistant:

AssertionResult CmpHelperEQ(const char* expected_expression,
                            const char* actual_expression,
                            const T1& expected,
                            const T2& actual) {
#ifdef _MSC_VER
# pragma warning(push)          // Saves the current warning state.
# pragma warning(disable:4389)  // Temporarily disables warning on
                                // signed/unsigned mismatch.
#endif

  if (expected == actual) {
    return AssertionSuccess();
  }

#ifdef _MSC_VER
# pragma warning(pop)          // Restores the warning state.
#endif

  return EqFailure(expected_expression,
                   actual_expression,
                   FormatForComparisonFailureMessage(expected, actual),
                   FormatForComparisonFailureMessage(actual, expected),
                   false);
}